

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.c
# Opt level: O2

void destroy_screenshot(SCREENSHOT *ss)

{
  free(ss->name);
  ss->name = (char *)0x0;
  free(ss->ext);
  free(ss);
  return;
}

Assistant:

void destroy_screenshot(SCREENSHOT * ss)
{
   free(ss->name);
   ss->name = NULL;
   free(ss->ext);
   ss->ext = NULL;
   free(ss);
   ss = NULL;
}